

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

void P_LoadLineDefs(MapData *map)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  DWORD DVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  line_t *plVar9;
  maplinedef_t *buffer;
  maplinedef_t *__dest;
  int *piVar10;
  double dVar11;
  double dVar12;
  line_t *local_70;
  int v2;
  int v1;
  maplinedef_t *local_38;
  maplinedef_t *mld;
  char *mldf;
  line_t *plStack_20;
  int lumplen;
  line_t *ld;
  int skipped;
  int i;
  MapData *map_local;
  
  DVar4 = MapData::Size(map,2);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(int)DVar4;
  numlines = SUB164(auVar1 / ZEXT816(0xe),0);
  uVar7 = (ulong)numlines;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar7;
  uVar8 = SUB168(auVar2 * ZEXT816(0x98),0);
  if (SUB168(auVar2 * ZEXT816(0x98),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  plVar9 = (line_t *)operator_new__(uVar8);
  if (uVar7 != 0) {
    local_70 = plVar9;
    do {
      line_t::line_t(local_70);
      local_70 = local_70 + 1;
    } while (local_70 != plVar9 + uVar7);
  }
  lines = plVar9;
  TArray<int,_int>::Resize(&linemap,numlines);
  memset(lines,0,(long)numlines * 0x98);
  buffer = (maplinedef_t *)operator_new__((long)(int)DVar4);
  MapData::Read(map,2,buffer,-1);
  ld._4_4_ = 0;
  sidecount = 0;
  ld._0_4_ = 0;
  do {
    while( true ) {
      while( true ) {
        if (numlines <= (int)ld._4_4_) {
          P_AllocateSideDefs(sidecount);
          plStack_20 = lines;
          local_38 = buffer;
          for (ld._4_4_ = 0; (int)ld._4_4_ < numlines; ld._4_4_ = ld._4_4_ + 1) {
            plStack_20->alpha = 1.0;
            plStack_20->portalindex = 0xffffffff;
            P_TranslateLineDef(plStack_20,local_38,-1);
            if ((plStack_20->special != 0xbe) ||
               ((plStack_20->args[1] != 0xfe && (plStack_20->args[1] != 0xfd)))) {
              FTagManager::AddLineID(&tagManager,ld._4_4_,(int)local_38->tag);
            }
            if ((plStack_20->special == 0xbe) && (plStack_20->args[1] == 0xfe)) {
              ProcessEDLinedef(plStack_20,(int)local_38->tag);
            }
            plStack_20->v1 = vertexes + local_38->v1;
            plStack_20->v2 = vertexes + local_38->v2;
            P_SetSideNum(plStack_20->sidedef,local_38->sidenum[0]);
            P_SetSideNum(plStack_20->sidedef + 1,local_38->sidenum[1]);
            P_AdjustLine(plStack_20);
            P_SaveLineSpecial(plStack_20);
            if ((level.flags2 & 0x200) != 0) {
              plStack_20->flags = plStack_20->flags | 0x80000;
            }
            if ((level.flags2 & 0x400) != 0) {
              plStack_20->flags = plStack_20->flags | 0x100000;
            }
            if ((level.flags2 & 0x800) != 0) {
              plStack_20->flags = plStack_20->flags | 0x400000;
            }
            local_38 = local_38 + 1;
            plStack_20 = plStack_20 + 1;
          }
          if (buffer != (maplinedef_t *)0x0) {
            operator_delete__(buffer);
          }
          return;
        }
        __dest = buffer + (int)ld._4_4_;
        uVar5 = (uint)__dest->v1;
        uVar6 = (uint)__dest->v2;
        if (((int)uVar5 < numvertexes) && ((int)uVar6 < numvertexes)) break;
        if (buffer != (maplinedef_t *)0x0) {
          operator_delete__(buffer);
        }
        I_Error("Line %d has invalid vertices: %d and/or %d.\nThe map only contains %d vertices.",
                (ulong)(ld._4_4_ + (int)ld),(ulong)uVar5,(ulong)uVar6,(ulong)(uint)numvertexes);
      }
      if (uVar5 != uVar6) break;
LAB_006b9529:
      Printf("Removing 0-length line %d\n",(ulong)(ld._4_4_ + (int)ld));
      memmove(__dest,__dest + 1,(long)(int)((numlines - ld._4_4_) + -1) * 0xe);
      ForceNodeBuild = true;
      ld._0_4_ = (int)ld + 1;
      numlines = numlines + -1;
    }
    dVar11 = vertex_t::fX(vertexes + __dest->v1);
    dVar12 = vertex_t::fX(vertexes + __dest->v2);
    if ((dVar11 == dVar12) && (!NAN(dVar11) && !NAN(dVar12))) {
      dVar11 = vertex_t::fY(vertexes + __dest->v1);
      dVar12 = vertex_t::fY(vertexes + __dest->v2);
      if ((dVar11 == dVar12) && (!NAN(dVar11) && !NAN(dVar12))) goto LAB_006b9529;
    }
    if (__dest->sidenum[0] == 0xffff) {
      Printf("Line %d has no first side.\n",(ulong)ld._4_4_);
      __dest->sidenum[0] = 0;
    }
    iVar3 = sidecount + 1;
    if (__dest->sidenum[1] != 0xffff) {
      iVar3 = sidecount + 2;
    }
    sidecount = iVar3;
    piVar10 = TArray<int,_int>::operator[](&linemap,(long)(int)ld._4_4_);
    *piVar10 = ld._4_4_ + (int)ld;
    ld._4_4_ = ld._4_4_ + 1;
  } while( true );
}

Assistant:

void P_LoadLineDefs (MapData * map)
{
	int i, skipped;
	line_t *ld;
	int lumplen = map->Size(ML_LINEDEFS);
	char * mldf;
	maplinedef_t *mld;
		
	numlines = lumplen / sizeof(maplinedef_t);
	lines = new line_t[numlines];
	linemap.Resize(numlines);
	memset (lines, 0, numlines*sizeof(line_t));

	mldf = new char[lumplen];
	map->Read(ML_LINEDEFS, mldf);

	// [RH] Count the number of sidedef references. This is the number of
	// sidedefs we need. The actual number in the SIDEDEFS lump might be less.
	// Lines with 0 length are also removed.

	for (skipped = sidecount = i = 0; i < numlines; )
	{
		mld = ((maplinedef_t*)mldf) + i;
		int v1 = LittleShort(mld->v1);
		int v2 = LittleShort(mld->v2);

		if (v1 >= numvertexes || v2 >= numvertexes)
		{
			delete [] mldf;
			I_Error ("Line %d has invalid vertices: %d and/or %d.\nThe map only contains %d vertices.", i+skipped, v1, v2, numvertexes);
		}
		else if (v1 == v2 ||
			(vertexes[LittleShort(mld->v1)].fX() == vertexes[LittleShort(mld->v2)].fX() &&
			 vertexes[LittleShort(mld->v1)].fY() == vertexes[LittleShort(mld->v2)].fY()))
		{
			Printf ("Removing 0-length line %d\n", i+skipped);
			memmove (mld, mld+1, sizeof(*mld)*(numlines-i-1));
			ForceNodeBuild = true;
			skipped++;
			numlines--;
		}
		else
		{
			// patch missing first sides instead of crashing out.
			// Visual glitches are better than not being able to play.
			if (LittleShort(mld->sidenum[0]) == NO_INDEX)
			{
				Printf("Line %d has no first side.\n", i);
				mld->sidenum[0] = 0;
			}
			sidecount++;
			if (LittleShort(mld->sidenum[1]) != NO_INDEX)
				sidecount++;
			linemap[i] = i+skipped;
			i++;
		}
	}

	P_AllocateSideDefs (sidecount);

	mld = (maplinedef_t *)mldf;
	ld = lines;
	for (i = 0; i < numlines; i++, mld++, ld++)
	{
		ld->alpha = 1.;	// [RH] Opaque by default
		ld->portalindex = UINT_MAX;

		// [RH] Translate old linedef special and flags to be
		//		compatible with the new format.

		P_TranslateLineDef (ld, mld, -1);
		// do not assign the tag for Extradata lines.
		if (ld->special != Static_Init || (ld->args[1] != Init_EDLine && ld->args[1] != Init_EDSector))
		{
			tagManager.AddLineID(i, mld->tag);
		}
#ifndef NO_EDATA
		if (ld->special == Static_Init && ld->args[1] == Init_EDLine)
		{
			ProcessEDLinedef(ld, mld->tag);
		}
#endif

		ld->v1 = &vertexes[LittleShort(mld->v1)];
		ld->v2 = &vertexes[LittleShort(mld->v2)];

		P_SetSideNum (&ld->sidedef[0], LittleShort(mld->sidenum[0]));
		P_SetSideNum (&ld->sidedef[1], LittleShort(mld->sidenum[1]));

		P_AdjustLine (ld);
		P_SaveLineSpecial (ld);
		if (level.flags2 & LEVEL2_CLIPMIDTEX) ld->flags |= ML_CLIP_MIDTEX;
		if (level.flags2 & LEVEL2_WRAPMIDTEX) ld->flags |= ML_WRAP_MIDTEX;
		if (level.flags2 & LEVEL2_CHECKSWITCHRANGE) ld->flags |= ML_CHECKSWITCHRANGE;
	}
	delete[] mldf;
}